

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exepath.cpp
# Opt level: O2

string * fs_exe_path_abi_cxx11_(void)

{
  size_t __n;
  ssize_t sVar1;
  size_type *psVar2;
  string *in_RDI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __n = fs_get_max_path();
  paVar3 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_38,__n,'\0');
  sVar1 = readlink("/proc/self/exe",local_38._M_dataplus._M_p,local_38._M_string_length);
  if (sVar1 < 1) {
    fs_print_error("","fs_exe_path");
    paVar3 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)paVar3;
    psVar2 = &in_RDI->_M_string_length;
  }
  else {
    std::__cxx11::string::resize((ulong)&local_38);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == paVar3) {
      (in_RDI->field_2)._M_allocated_capacity = local_38.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_38.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity = local_38.field_2._M_allocated_capacity;
    }
    psVar2 = &local_38._M_string_length;
    in_RDI->_M_string_length = local_38._M_string_length;
    local_38._M_dataplus._M_p = (pointer)paVar3;
  }
  *psVar2 = 0;
  paVar3->_M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&local_38);
  return in_RDI;
}

Assistant:

std::string fs_exe_path()
{
  // https://stackoverflow.com/a/4031835
  // https://stackoverflow.com/a/1024937

  std::string path(fs_get_max_path(), '\0');
  std::string::size_type L = 0;

#if defined(_WIN32) || defined(__CYGWIN__)
  // https://learn.microsoft.com/en-us/windows/win32/api/libloaderapi/nf-libloaderapi-getmodulefilenamea
  if (DWORD M = GetModuleFileNameA(nullptr, path.data(), static_cast<DWORD>(path.size()));
        M > 0 && GetLastError() != ERROR_INSUFFICIENT_BUFFER) FFS_LIKELY
    L = static_cast<std::size_t>(M);
#elif defined(__linux__)
  // https://man7.org/linux/man-pages/man2/readlink.2.html
  if(ssize_t M = readlink("/proc/self/exe", path.data(), path.size()); M > 0)  FFS_LIKELY
    L = static_cast<std::size_t>(M);
#elif defined(__APPLE__) && defined(__MACH__)
  // https://developer.apple.com/library/archive/documentation/System/Conceptual/ManPages_iPhoneOS/man3/dyld.3.html
  // get buffer size first. Need mp=0 to avoid intermittent segfault.
  if(std::uint32_t mp = 0;
      _NSGetExecutablePath(nullptr, &mp) == -1 &&
      _NSGetExecutablePath(path.data(), &mp) == 0)  FFS_LIKELY
      L = static_cast<std::size_t>(mp-1);
#elif defined(BSD)
  // https://man.freebsd.org/cgi/man.cgi?sysctl(3)
  std::size_t M = path.size();
  const int mib[4] = {CTL_KERN, KERN_PROC, KERN_PROC_PATHNAME, -1};
  if(sysctl(mib, 4, path.data(), &M, nullptr, 0) == 0)  FFS_LIKELY
    L = M;
#endif

  if(L > 0)  FFS_LIKELY
  {
    path.resize(L);
    return path;
  }